

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O2

void terminal_clear_EOL(EditLine *el,wchar_t num)

{
  char *cap;
  wchar_t wVar1;
  
  if (((((el->el_terminal).t_flags & L'\x04') != L'\0') &&
      (cap = (el->el_terminal).t_str[3], cap != (char *)0x0)) && (*cap != '\0')) {
    terminal_tputs(el,cap,L'\x01');
    return;
  }
  wVar1 = L'\0';
  if (L'\0' < num) {
    wVar1 = num;
  }
  while (wVar1 != L'\0') {
    terminal__putc(el,0x20);
    wVar1 = wVar1 + L'\xffffffff';
  }
  (el->el_cursor).h = (el->el_cursor).h + num;
  return;
}

Assistant:

libedit_private void
terminal_clear_EOL(EditLine *el, int num)
{
	int i;

	if (EL_CAN_CEOL && GoodStr(T_ce))
		terminal_tputs(el, Str(T_ce), 1);
	else {
		for (i = 0; i < num; i++)
			terminal__putc(el, ' ');
		el->el_cursor.h += num;	/* have written num spaces */
	}
}